

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

bool slang::ast::canConnectToRefArg
               (ASTContext *context,Expression *expr,bitmask<slang::ast::VariableFlags> argFlags,
               bool allowConstClassHandle,bool disallowDynamicArrays)

{
  ExpressionKind EVar1;
  byte bVar2;
  bool bVar3;
  Symbol *pSVar4;
  VariableSymbol *pVVar5;
  ElementSelectExpression *this;
  RangeSelectExpression *this_00;
  MemberAccessExpression *this_01;
  byte in_CL;
  byte bVar6;
  ASTContext *in_RSI;
  undefined8 in_RDI;
  byte in_R8B;
  bool isRefStatic;
  VariableSymbol *var;
  Symbol *sym;
  Type *in_stack_ffffffffffffff78;
  bitmask<slang::ast::VariableFlags> *in_stack_ffffffffffffff80;
  byte local_52;
  byte local_51;
  byte local_41;
  bool in_stack_ffffffffffffffc7;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined2 uVar7;
  undefined6 in_stack_ffffffffffffffe0;
  bitmask<slang::ast::VariableFlags> argFlags_00;
  
  argFlags_00.m_bits = (underlying_type)((ulong)in_RDI >> 0x20);
  bVar6 = in_CL & 1;
  bVar2 = in_R8B & 1;
  pSVar4 = Expression::getSymbolReference
                     ((Expression *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc7);
  if (pSVar4 != (Symbol *)0x0) {
    bVar3 = VariableSymbol::isKind(pSVar4->kind);
    uVar7 = (undefined2)((ulong)pSVar4 >> 0x30);
    if (bVar3) {
      pVVar5 = Symbol::as<slang::ast::VariableSymbol>((Symbol *)0x1258a29);
      bitmask<slang::ast::VariableFlags>::bitmask
                ((bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffce,Const);
      bVar3 = bitmask<slang::ast::VariableFlags>::has
                        (in_stack_ffffffffffffff80,
                         (bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff78);
      local_41 = 0;
      if (!bVar3) {
        bitmask<slang::ast::VariableFlags>::bitmask
                  ((bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffcc,Const);
        bVar3 = bitmask<slang::ast::VariableFlags>::has
                          (in_stack_ffffffffffffff80,
                           (bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff78);
        local_41 = 0;
        if (bVar3) {
          local_51 = 1;
          if ((bVar6 & 1) != 0) {
            ValueSymbol::getType((ValueSymbol *)0x1258ab0);
            bVar3 = Type::isClass((Type *)0x1258ab8);
            local_51 = bVar3 ^ 0xff;
          }
          local_41 = local_51;
        }
      }
      if ((local_41 & 1) != 0) {
        return false;
      }
      bitmask<slang::ast::VariableFlags>::bitmask
                ((bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffc8,RefStatic);
      bVar3 = bitmask<slang::ast::VariableFlags>::has
                        (in_stack_ffffffffffffff80,
                         (bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff78);
      if (bVar3) {
        local_52 = 0;
        if (pVVar5->lifetime == Automatic) {
          bitmask<slang::ast::VariableFlags>::bitmask
                    ((bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffc6,RefStatic);
          bVar3 = bitmask<slang::ast::VariableFlags>::has
                            (in_stack_ffffffffffffff80,
                             (bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff78);
          local_52 = bVar3 ^ 0xff;
        }
        if ((local_52 & 1) != 0) {
          return false;
        }
        if ((bVar2 & 1) != 0) {
          ValueSymbol::getType((ValueSymbol *)0x1258b7f);
          bVar3 = Type::isDynamicallySizedArray(in_stack_ffffffffffffff78);
          if (bVar3) {
            return false;
          }
        }
      }
      EVar1 = *(ExpressionKind *)&(in_RSI->scope).ptr;
      if (EVar1 == ElementSelect) {
        this = Expression::as<slang::ast::ElementSelectExpression>((Expression *)in_RSI);
        ElementSelectExpression::value(this);
        bVar3 = canConnectToRefArg(in_RSI,(Expression *)
                                          CONCAT17(bVar6,CONCAT16(bVar2,in_stack_ffffffffffffffe0)),
                                   argFlags_00,SUB21((ushort)uVar7 >> 8,0),SUB21(uVar7,0));
        return bVar3;
      }
      if (EVar1 != RangeSelect) {
        if (EVar1 != MemberAccess) {
          return true;
        }
        this_01 = Expression::as<slang::ast::MemberAccessExpression>((Expression *)in_RSI);
        MemberAccessExpression::value(this_01);
        bVar3 = canConnectToRefArg(in_RSI,(Expression *)
                                          CONCAT17(bVar6,CONCAT16(bVar2,in_stack_ffffffffffffffe0)),
                                   argFlags_00,SUB21((ushort)uVar7 >> 8,0),SUB21(uVar7,0));
        return bVar3;
      }
      this_00 = Expression::as<slang::ast::RangeSelectExpression>((Expression *)in_RSI);
      RangeSelectExpression::value(this_00);
      bVar3 = canConnectToRefArg(in_RSI,(Expression *)
                                        CONCAT17(bVar6,CONCAT16(bVar2,in_stack_ffffffffffffffe0)),
                                 argFlags_00,SUB21((ushort)uVar7 >> 8,0),SUB21(uVar7,0));
      return bVar3;
    }
  }
  return false;
}

Assistant:

static bool canConnectToRefArg(const ASTContext& context, const Expression& expr,
                               bitmask<VariableFlags> argFlags, bool allowConstClassHandle = false,
                               bool disallowDynamicArrays = false) {
    auto sym = expr.getSymbolReference(/* allowPacked */ false);
    if (!sym || !VariableSymbol::isKind(sym->kind))
        return false;

    auto& var = sym->as<VariableSymbol>();
    if (!argFlags.has(VariableFlags::Const) && var.flags.has(VariableFlags::Const) &&
        (!allowConstClassHandle || !var.getType().isClass())) {
        return false;
    }

    const bool isRefStatic = argFlags.has(VariableFlags::RefStatic);
    if (isRefStatic) {
        if (var.lifetime == VariableLifetime::Automatic &&
            !var.flags.has(VariableFlags::RefStatic)) {
            return false;
        }

        if (disallowDynamicArrays && var.getType().isDynamicallySizedArray())
            return false;
    }

    // Need to recursively check the left hand side of element selects and member accesses
    // to be sure this is actually an lvalue and not, for example, the result of a
    // function call or something.
    switch (expr.kind) {
        case ExpressionKind::ElementSelect:
            return canConnectToRefArg(context, expr.as<ElementSelectExpression>().value(), argFlags,
                                      false, isRefStatic);
        case ExpressionKind::RangeSelect:
            return canConnectToRefArg(context, expr.as<RangeSelectExpression>().value(), argFlags,
                                      false, isRefStatic);
        case ExpressionKind::MemberAccess:
            return canConnectToRefArg(context, expr.as<MemberAccessExpression>().value(), argFlags,
                                      true);
        default:
            return true;
    }
}